

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::~IfcTransportElementType
          (IfcTransportElementType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject
                   + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            lVar2);
  pvVar1 = &this->field_0x1a0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1a0) = 0x98e3f0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x98e4e0;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x98e418;
  *(undefined8 *)((long)pvVar1 + -0x108) = 0x98e440;
  *(undefined8 *)((long)pvVar1 + -0xb0) = 0x98e468;
  *(undefined8 *)((long)pvVar1 + -0x58) = 0x98e490;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x98e4b8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x98e640;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x50 = 0x98e708;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x98e668;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x98e690;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x98e6b8;
  *(undefined8 *)&this_00->field_0x148 = 0x98e6e0;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__0098e500);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}